

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
args::Matcher::GetFlagStrings
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Matcher *this,string *shortPrefix,string *longPrefix,string *name
          ,string *shortSeparator,string *longSeparator)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  undefined8 *puVar3;
  size_type *psVar4;
  long *plVar5;
  _Hash_node_base *p_Var6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *flagStrings;
  string bracedname;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  Matcher *local_60;
  string *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_e8 = &local_d8;
  local_c8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  local_58 = longPrefix;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"[","");
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_e8,(ulong)(name->_M_dataplus)._M_p);
  paVar1 = &local_c0.field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_c0.field_2._M_allocated_capacity = *psVar4;
    local_c0.field_2._8_8_ = plVar2[3];
    local_c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar4;
    local_c0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_c0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_c0);
  local_80 = &local_70;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_70 = *plVar5;
    lStack_68 = plVar2[3];
  }
  else {
    local_70 = *plVar5;
    local_80 = (long *)*plVar2;
  }
  local_78 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  *(undefined8 *)local_c8 = 0;
  *(pointer *)(local_c8 + 8) = (pointer)0x0;
  *(pointer *)(local_c8 + 0x10) = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c8,
            (this->longFlags)._M_h._M_element_count + (this->shortFlags)._M_h._M_element_count);
  p_Var6 = (this->shortFlags)._M_h._M_before_begin._M_nxt;
  local_60 = this;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    do {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
      plVar2 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_50,0,(char *)0x0,
                                  (ulong)(shortPrefix->_M_dataplus)._M_p);
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_a0.field_2._M_allocated_capacity = *psVar4;
        local_a0.field_2._8_8_ = plVar2[3];
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar4;
        local_a0._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_a0._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_a0,(ulong)(shortSeparator->_M_dataplus)._M_p);
      local_e8 = &local_d8;
      plVar5 = plVar2 + 2;
      if ((long *)*plVar2 == plVar5) {
        local_d8 = *plVar5;
        lStack_d0 = plVar2[3];
      }
      else {
        local_d8 = *plVar5;
        local_e8 = (long *)*plVar2;
      }
      local_e0 = plVar2[1];
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_80);
      psVar4 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_c0.field_2._M_allocated_capacity = *psVar4;
        local_c0.field_2._8_8_ = puVar3[3];
        local_c0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar4;
        local_c0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_c0._M_string_length = puVar3[1];
      *puVar3 = psVar4;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_c8,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  p_Var6 = (local_60->longFlags)._M_h._M_before_begin._M_nxt;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    do {
      std::operator+(&local_a0,local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var6 + 1));
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_a0,(ulong)(longSeparator->_M_dataplus)._M_p);
      local_e8 = &local_d8;
      plVar2 = puVar3 + 2;
      if ((long *)*puVar3 == plVar2) {
        local_d8 = *plVar2;
        lStack_d0 = puVar3[3];
      }
      else {
        local_d8 = *plVar2;
        local_e8 = (long *)*puVar3;
      }
      local_e0 = puVar3[1];
      *puVar3 = plVar2;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_80);
      psVar4 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_c0.field_2._M_allocated_capacity = *psVar4;
        local_c0.field_2._8_8_ = puVar3[3];
        local_c0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar4;
        local_c0._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_c0._M_string_length = puVar3[1];
      *puVar3 = psVar4;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_c8,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_c8;
}

Assistant:

std::vector<std::string> GetFlagStrings(const std::string &shortPrefix, const std::string &longPrefix, const std::string &name, const std::string &shortSeparator, const std::string longSeparator) const
            {
                const std::string bracedname(std::string("[") + name + "]");
                std::vector<std::string> flagStrings;
                flagStrings.reserve(shortFlags.size() + longFlags.size());
                for (const char flag: shortFlags)
                {
                    flagStrings.emplace_back(shortPrefix + std::string(1, flag) + shortSeparator + bracedname);
                }
                for (const std::string &flag: longFlags)
                {
                    flagStrings.emplace_back(longPrefix + flag + longSeparator + bracedname);
                }
                return flagStrings;
            }